

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cost.cpp
# Opt level: O2

void __thiscall iDynTree::optimalcontrol::Cost::Cost(Cost *this,string *costName)

{
  this->_vptr_Cost = (_func_int **)&PTR__Cost_001d3ce0;
  std::__cxx11::string::string((string *)&this->m_costName,(string *)costName);
  return;
}

Assistant:

Cost::Cost(const std::string &costName)
            :m_costName(costName)
        { }